

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

ProgramContext * __thiscall
deqp::gles3::Performance::ShaderCompilerTextureCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerTextureCase *this,int measurementNdx
          )

{
  ConditionalType in_ECX;
  deUint32 id;
  ConditionalType in_R8D;
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  local_108;
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  local_f0;
  string local_d8;
  string local_b8;
  string local_88;
  string local_68;
  undefined1 local_41;
  undefined1 local_40 [8];
  string nameSpec;
  deUint32 specID;
  int measurementNdx_local;
  ShaderCompilerTextureCase *this_local;
  ProgramContext *result;
  
  nameSpec.field_2._12_4_ = measurementNdx;
  nameSpec.field_2._8_4_ =
       ShaderCompilerCase::getSpecializationID(&this->super_ShaderCompilerCase,measurementNdx);
  getNameSpecialization_abi_cxx11_
            ((string *)local_40,(Performance *)(ulong)(uint)nameSpec.field_2._8_4_,id);
  local_41 = 0;
  ShaderCompilerCase::ProgramContext::ProgramContext(__return_storage_ptr__);
  textureLookupVertexTemplate_abi_cxx11_
            (&local_88,(Performance *)(ulong)this->m_conditionalUsage,this->m_conditionalType,in_ECX
            );
  specializeShaderSource(&local_68,&local_88,nameSpec.field_2._8_4_,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  textureLookupFragmentTemplate_abi_cxx11_
            (&local_d8,(Performance *)(ulong)(uint)this->m_numLookups,this->m_conditionalUsage,
             this->m_conditionalType,in_R8D);
  specializeShaderSource(&local_b8,&local_d8,nameSpec.field_2._8_4_,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  textureLookupShaderAttributes
            (&local_f0,(string *)local_40,this->m_conditionalUsage,this->m_conditionalType);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::operator=(&__return_storage_ptr__->vertexAttributes,&local_f0);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector(&local_f0);
  textureLookupShaderUniforms
            (&local_108,(string *)local_40,this->m_numLookups,this->m_conditionalUsage,
             this->m_conditionalType);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::operator=(&__return_storage_ptr__->uniforms,&local_108);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector(&local_108);
  local_41 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerTextureCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(textureLookupVertexTemplate(m_conditionalUsage, m_conditionalType), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(textureLookupFragmentTemplate(m_numLookups, m_conditionalUsage, m_conditionalType), specID, SHADER_VALIDITY_VALID);
	result.vertexAttributes		= textureLookupShaderAttributes(nameSpec, m_conditionalUsage, m_conditionalType);
	result.uniforms				= textureLookupShaderUniforms(nameSpec, m_numLookups, m_conditionalUsage, m_conditionalType);

	return result;
}